

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

ptrlen ntru_decode_pubkey(uint16_t *pubkey,uint p,uint q,BinarySource *src)

{
  NTRUEncodeSchedule *sched;
  size_t sVar1;
  size_t wanted;
  ulong uVar2;
  short sVar3;
  uint uVar4;
  ptrlen data;
  
  sched = ntru_encode_pubkey_schedule(p,q);
  if (sched->nops == 0) {
    wanted = 0;
  }
  else {
    sVar1 = 0;
    wanted = 0;
    do {
      wanted = wanted + (sched->ops[sVar1] == 1);
      sVar1 = sVar1 + 1;
    } while (sched->nops != sVar1);
  }
  data = BinarySource_get_data(src->binarysource_,wanted);
  if (src->binarysource_->err == BSE_NO_ERROR) {
    ntru_decode(sched,pubkey,data);
    safefree(sched->ops);
    safefree(sched);
    if (p != 0) {
      uVar2 = 0;
      do {
        uVar4 = (uint)pubkey[uVar2] + (q - (q >> 1));
        sVar3 = (short)uVar4 -
                (short)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff)
                               ,0) * (ulong)uVar4 >> 0x30) * (short)q;
        uVar4 = q;
        if ((short)(sVar3 - (short)q) < 0) {
          uVar4 = 0;
        }
        pubkey[uVar2] = sVar3 - (short)uVar4;
        uVar2 = uVar2 + 1;
      } while (p != uVar2);
    }
  }
  else {
    memset(pubkey,0,(ulong)p * 2);
  }
  return data;
}

Assistant:

ptrlen ntru_decode_pubkey(uint16_t *pubkey, unsigned p, unsigned q,
                          BinarySource *src)
{
    NTRUEncodeSchedule *sched = ntru_encode_pubkey_schedule(p, q);

    /* Retrieve the right number of bytes from the source */
    size_t len = ntru_encode_schedule_length(sched);
    ptrlen encoded = get_data(src, len);
    if (get_err(src)) {
        /* If there wasn't enough data, give up and return all-zeroes
         * purely for determinism. But that value should never be
         * used, because the caller will also check get_err(src). */
        memset(pubkey, 0, p*sizeof(*pubkey));
    } else {
        /* Do the decoding */
        ntru_decode(sched, pubkey, encoded);
        ntru_encode_schedule_free(sched);

        /* Unbias the coefficients */
        ntru_bias(pubkey, pubkey, q-q/2, p, q);
    }

    return encoded;
}